

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::has_default_value(FieldGeneratorBase *this)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  LogMessage LStack_18;
  
  pFVar1 = this->descriptor_;
  switch(pFVar1->type_) {
  case '\x01':
    bVar2 = (pFVar1->field_20).default_value_double_ != 0.0;
    break;
  case '\x02':
    bVar2 = (pFVar1->field_20).default_value_float_ != 0.0;
    break;
  case '\x03':
  case '\x04':
  case '\x06':
  case '\x10':
  case '\x12':
    bVar2 = (pFVar1->field_20).default_value_int64_t_ == 0;
    goto LAB_00e8baa7;
  case '\x05':
  case '\a':
  case '\r':
  case '\x0f':
  case '\x11':
    bVar2 = (pFVar1->field_20).default_value_int32_t_ == 0;
LAB_00e8baa7:
    return !bVar2;
  case '\b':
    return (pFVar1->field_20).default_value_bool_;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\x0e':
    return true;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x12d);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [20])"Unknown field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  return (bool)(-bVar2 & 1);
}

Assistant:

bool FieldGeneratorBase::has_default_value() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return true;
    case FieldDescriptor::TYPE_DOUBLE:
      return descriptor_->default_value_double() != 0.0;
    case FieldDescriptor::TYPE_FLOAT:
      return descriptor_->default_value_float() != 0.0;
    case FieldDescriptor::TYPE_INT64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_UINT64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_INT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_FIXED64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_FIXED32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_BOOL:
      return descriptor_->default_value_bool();
    case FieldDescriptor::TYPE_STRING:
      return true;
    case FieldDescriptor::TYPE_BYTES:
      return true;
    case FieldDescriptor::TYPE_UINT32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_SFIXED32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SFIXED64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_SINT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SINT64:
      return descriptor_->default_value_int64() != 0L;
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return true;
  }
}